

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::UdpEntrySyntax::getChild(UdpEntrySyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff88;
  Info *in_stack_ffffffffffffff90;
  nullptr_t in_stack_ffffffffffffff98;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffff88);
    break;
  case 1:
    token.info = in_stack_ffffffffffffff90;
    token._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x3d0e53,token);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 3:
    token_00.info = in_stack_ffffffffffffff90;
    token_00._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x3d0e9b,token_00);
    break;
  case 4:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 5:
    token_01.info = in_stack_ffffffffffffff90;
    token_01._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x3d0ee3,token_01);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax UdpEntrySyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &inputs;
        case 1: return colon1;
        case 2: return current;
        case 3: return colon2;
        case 4: return next;
        case 5: return semi;
        default: return nullptr;
    }
}